

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiImageClearingTests.cpp
# Opt level: O3

void __thiscall
vkt::api::anon_unknown_0::ImageClearingTestInstance::pipelineImageBarrier
          (ImageClearingTestInstance *this,VkPipelineStageFlags srcStageMask,
          VkPipelineStageFlags dstStageMask,VkAccessFlags srcAccessMask,VkAccessFlags dstAccessMask,
          VkImageLayout oldLayout,VkImageLayout newLayout)

{
  undefined4 local_50 [2];
  undefined8 local_48;
  VkAccessFlags local_40;
  VkAccessFlags local_3c;
  VkImageLayout local_38;
  VkImageLayout local_34;
  undefined8 local_30;
  deUint64 local_28;
  VkImageAspectFlags local_20;
  undefined4 local_1c;
  undefined4 uStack_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  
  local_50[0] = 0x2d;
  local_48 = 0;
  local_34 = newLayout;
  local_30 = 0xffffffffffffffff;
  local_28 = (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  local_20 = this->m_imageAspectFlags;
  local_1c = 0;
  uStack_18 = 0xffffffff;
  uStack_14 = 0;
  uStack_10 = 1;
  local_40 = srcAccessMask;
  local_3c = dstAccessMask;
  local_38 = oldLayout;
  (*this->m_vkd->_vptr_DeviceInterface[0x6d])
            (this->m_vkd,
             (this->m_commandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             srcStageMask,dstStageMask,0,0,0,0,0,1,local_50);
  return;
}

Assistant:

void ImageClearingTestInstance::pipelineImageBarrier(VkPipelineStageFlags srcStageMask, VkPipelineStageFlags dstStageMask, VkAccessFlags srcAccessMask, VkAccessFlags dstAccessMask, VkImageLayout oldLayout, VkImageLayout newLayout) const
{
	const VkImageMemoryBarrier		imageBarrier	=
	{
		VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,		// VkStructureType			sType;
		DE_NULL,									// const void*				pNext;
		srcAccessMask,								// VkAccessFlags			srcAccessMask;
		dstAccessMask,								// VkAccessFlags			dstAccessMask;
		oldLayout,									// VkImageLayout			oldLayout;
		newLayout,									// VkImageLayout			newLayout;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32					srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32					destQueueFamilyIndex;
		*m_image,									// VkImage					image;
		{
			m_imageAspectFlags,							// VkImageAspectFlags	aspectMask;
			0u,											// deUint32				baseMipLevel;
			VK_REMAINING_MIP_LEVELS,					// deUint32				levelCount;
			0u,											// deUint32				baseArrayLayer;
			1u,											// deUint32				layerCount;
		},											// VkImageSubresourceRange	subresourceRange;
	};

	m_vkd.cmdPipelineBarrier(*m_commandBuffer, srcStageMask, dstStageMask, 0, 0, DE_NULL, 0, DE_NULL, 1, &imageBarrier);
}